

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_pthreads_threading.cpp
# Opt level: O0

int __thiscall lzham::task_pool::init(task_pool *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  ulong extraout_RAX;
  int status;
  bool succeeded;
  undefined4 in_stack_ffffffffffffffe0;
  uint in_stack_ffffffffffffffe4;
  
  uVar2 = math::minimum<unsigned_int>((uint)ctx,0x10);
  deinit((task_pool *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  bVar1 = true;
  this->m_num_threads = 0;
  do {
    uVar3 = this->m_num_threads;
    if (uVar2 <= uVar3) {
LAB_0011bcf6:
      uVar4 = (ulong)uVar3;
      if (!bVar1) {
        deinit((task_pool *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
        uVar4 = extraout_RAX;
      }
      return (int)CONCAT71((int7)(uVar4 >> 8),bVar1);
    }
    uVar3 = pthread_create(this->m_threads + this->m_num_threads,(pthread_attr_t *)0x0,thread_func,
                           this);
    in_stack_ffffffffffffffe4 = uVar3;
    if (uVar3 != 0) {
      bVar1 = false;
      goto LAB_0011bcf6;
    }
    this->m_num_threads = this->m_num_threads + 1;
  } while( true );
}

Assistant:

bool task_pool::init(uint num_threads)
   {
      LZHAM_ASSERT(num_threads <= cMaxThreads);
      num_threads = math::minimum<uint>(num_threads, cMaxThreads);

      deinit();

      bool succeeded = true;

      m_num_threads = 0;
      while (m_num_threads < num_threads)
      {
         int status = pthread_create(&m_threads[m_num_threads], NULL, thread_func, this);
         if (status)
         {
            succeeded = false;
            break;
         }

         m_num_threads++;
      }

      if (!succeeded)
      {
         deinit();
         return false;
      }

      return true;
   }